

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O3

void __thiscall IPAsKeyLRU::IPAsKeyLRU(IPAsKeyLRU *this,uint8_t *addr,size_t addr_len)

{
  size_t __n;
  
  (this->super_IPAsKey)._vptr_IPAsKey = (_func_int **)&PTR__IPAsKeyLRU_001e0560;
  (this->super_IPAsKey).HashNext = (IPAsKey *)0x0;
  (this->super_IPAsKey).count = 1;
  (this->super_IPAsKey).hash = 0;
  __n = 0x10;
  if (addr_len < 0x10) {
    __n = addr_len;
  }
  memcpy((this->super_IPAsKey).addr,addr,__n);
  (this->super_IPAsKey).addr_len = __n;
  (this->super_IPAsKey)._vptr_IPAsKey = (_func_int **)&PTR__IPAsKeyLRU_001e0590;
  this->MoreRecentKey = (IPAsKeyLRU *)0x0;
  this->LessRecentKey = (IPAsKeyLRU *)0x0;
  return;
}

Assistant:

IPAsKeyLRU::IPAsKeyLRU(uint8_t * addr, size_t addr_len)
    :
    IPAsKey(addr, addr_len),
    MoreRecentKey(NULL),
    LessRecentKey(NULL)
{
}